

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

slot_type * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
::slot_array(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
             *this)

{
  if (*(long *)this == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x101b,
                  "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::slot_array() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  if (*(long *)this != 0) {
    return *(slot_type **)(this + 0x18);
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
               );
}

Assistant:

slot_type* slot_array() const {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    return static_cast<slot_type*>(common().slot_array());
  }